

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

bool __thiscall AActor::HasSpecialDeathStates(AActor *this)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  undefined4 extraout_var;
  int *piVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  piVar2 = *(int **)&(this->super_DThinker).super_DObject.Class[1].super_PNativeStruct.super_PStruct
                     .super_PNamedType.super_PCompoundType.super_PType.Align;
  piVar4 = (int *)0x0;
  if (piVar2 != (int *)0x0) {
    iVar3 = *piVar2 + -1;
    iVar7 = 0;
    do {
      if (iVar3 < iVar7) {
        piVar4 = (int *)0x0;
        break;
      }
      uVar6 = (uint)(iVar3 + iVar7) >> 1;
      iVar1 = piVar2[(ulong)uVar6 * 6 + 2];
      if (iVar1 == 0x8c) {
        piVar4 = piVar2 + (ulong)uVar6 * 6 + 2;
      }
      else if (iVar1 < 0x8c) {
        iVar7 = uVar6 + 1;
      }
      else {
        iVar3 = uVar6 - 1;
      }
    } while (iVar1 != 0x8c);
    if (((piVar4 == (int *)0x0) || (piVar2 = *(int **)(piVar4 + 4), piVar2 == (int *)0x0)) ||
       ((long)*piVar2 < 1)) {
      piVar4 = (int *)0x0;
    }
    else {
      lVar5 = 0;
      do {
        bVar8 = *(long *)((long)piVar2 + lVar5 + 0x10) != 0;
        piVar4 = (int *)(ulong)bVar8;
        if (bVar8) break;
        bVar8 = (long)*piVar2 * 0x18 + -0x18 != lVar5;
        lVar5 = lVar5 + 0x18;
      } while (bVar8);
    }
  }
  return SUB81(piVar4,0);
}

Assistant:

bool AActor::HasSpecialDeathStates () const
{
	const PClassActor *info = static_cast<PClassActor *>(GetClass());

	if (info->StateList != NULL)
	{
		FStateLabel *slabel = info->StateList->FindLabel (NAME_Death);
		if (slabel != NULL && slabel->Children != NULL)
		{
			for(int i = 0; i < slabel->Children->NumLabels; i++)
			{
				if (slabel->Children->Labels[i].State != NULL)
				{
					return true;
				}
			}
		}
	}
	return false;
}